

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<unsigned_short,unsigned_int>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<unsigned_short,unsigned_int>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_short,unsigned_int>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_short,_unsigned_int>::b1 =
           LessThanTest<unsigned_short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_short,unsigned_int>()::b1);
    }
  }
  if (ComparisonTestTU<unsigned_short,unsigned_int>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_short,unsigned_int>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_short,_unsigned_int>::b2 =
           LessThanEqualTest<unsigned_short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_short,unsigned_int>()::b2);
    }
  }
  if (ComparisonTestTU<unsigned_short,unsigned_int>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_short,unsigned_int>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_short,_unsigned_int>::b3 =
           GreaterThanTest<unsigned_short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_short,unsigned_int>()::b3);
    }
  }
  if (ComparisonTestTU<unsigned_short,unsigned_int>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_short,unsigned_int>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_short,_unsigned_int>::b4 =
           GreaterThanEqualTest<unsigned_short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_short,unsigned_int>()::b4);
    }
  }
  if (ComparisonTestTU<unsigned_short,unsigned_int>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_short,unsigned_int>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_short,_unsigned_int>::b5 = EqualTest<unsigned_short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_short,unsigned_int>()::b5);
    }
  }
  if (ComparisonTestTU<unsigned_short,unsigned_int>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<unsigned_short,unsigned_int>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<unsigned_short,_unsigned_int>::b6 =
           NotEqualTest<unsigned_short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<unsigned_short,unsigned_int>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}